

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O2

int Test_N_VWSqrSumMaskLocal(N_Vector X,N_Vector W,N_Vector ID,sunindextype param_4,int myid)

{
  long ie;
  int iVar1;
  double __x;
  sunrealtype val;
  double dVar2;
  double dVar3;
  double dVar4;
  sunrealtype local_50;
  
  __x = (double)myid;
  if (myid < 1) {
    val = 0.0;
  }
  else if (__x < 0.0) {
    val = sqrt(__x);
  }
  else {
    val = SQRT(__x);
  }
  ie = param_4 + -1;
  if (param_4 < 2) {
    local_50 = INFINITY;
  }
  else {
    local_50 = 1.0 / SQRT((double)ie);
  }
  set_element_range(X,0,ie,val);
  set_element_range(W,0,ie,local_50);
  N_VConst(0x3ff0000000000000,ID);
  set_element(ID,ie,0.0);
  dVar2 = get_time();
  dVar3 = (double)N_VWSqrSumMaskLocal(X,W,ID);
  sync_device(X);
  dVar4 = get_time();
  if (0.0 <= dVar3) {
    iVar1 = SUNRCompareTol(dVar3,__x,0x3e50000000000000);
    if (iVar1 == 0) {
      iVar1 = 0;
      if (myid == 0) {
        puts("PASSED test -- N_VWSqrSumMaskLocal");
      }
      goto LAB_0010bc3c;
    }
  }
  printf(">>> FAILED test -- N_VWSqrSumMaskLocal, Proc %d\n",(ulong)(uint)myid);
  iVar1 = 1;
LAB_0010bc3c:
  max_time(X,dVar4 - dVar2);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VWSqrSumMaskLocal");
  }
  return iVar1;
}

Assistant:

int Test_N_VWSqrSumMaskLocal(N_Vector X, N_Vector W, N_Vector ID,
                             sunindextype local_length, int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;
  sunrealtype ans, xval, wval;

  /* fill vector data */
  xval = SUNRsqrt(myid);
  wval = ONE / SUNRsqrt(local_length - 1);
  set_element_range(X, 0, local_length - 1, xval);
  set_element_range(W, 0, local_length - 1, wval);

  /* use all elements except one */
  N_VConst(ONE, ID);
  set_element(ID, local_length - 1, ZERO);

  start_time = get_time();
  ans        = N_VWSqrSumMaskLocal(X, W, ID);
  sync_device(X);
  stop_time = get_time();

  /* ans should equal myid */
  failure = (ans < ZERO) ? 1
                         : SUNRCompareTol(ans, (sunrealtype)myid,
                                          SUNRsqrt(SUN_UNIT_ROUNDOFF));

  if (failure)
  {
    printf(">>> FAILED test -- N_VWSqrSumMaskLocal, Proc %d\n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VWSqrSumMaskLocal\n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VWSqrSumMaskLocal", maxt);

  return (fails);
}